

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_MeshTopology::IsValid(ON_MeshTopology *this)

{
  int mesh_vertex_count;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ON_Mesh *pOVar11;
  int *piVar12;
  ON_MeshTopologyFace *pOVar13;
  bool bVar14;
  int iVar15;
  void *__s;
  size_t sVar16;
  ulong uVar17;
  ON_MeshTopology *top;
  long lVar18;
  ON_MeshFace *pOVar19;
  size_t size;
  ON_MeshFace *this_00;
  long lVar20;
  long lVar21;
  ON_MeshTopologyEdge *pOVar22;
  ON_MeshTopologyVertex *pOVar23;
  int tfvi [4];
  ON_Workspace ws;
  ON_3fPoint p;
  int local_88 [4];
  ON_MeshTopologyEdge *local_78;
  ON_MeshFace *local_70;
  ON_Workspace local_68;
  ON_3fPoint local_54;
  ON_3dPoint local_48;
  
  ON_Workspace::ON_Workspace(&local_68);
  if ((this->m_b32IsValid == 1) && (pOVar11 = this->m_mesh, pOVar11 != (ON_Mesh *)0x0)) {
    if ((pOVar11->m_top).m_b32IsValid == 0) {
      (pOVar11->m_top).m_mesh = pOVar11;
      bVar14 = Create(&pOVar11->m_top);
      (pOVar11->m_top).m_b32IsValid = (uint)bVar14;
    }
    if (&pOVar11->m_top == this) {
      mesh_vertex_count = (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      size = (size_t)mesh_vertex_count;
      uVar1 = (this->m_topv).m_count;
      if (-1 < (int)uVar1 && (int)uVar1 <= mesh_vertex_count) {
        bVar14 = false;
        if (mesh_vertex_count < 1 || (ulong)uVar1 != 0) {
          uVar2 = (this->m_mesh->m_F).m_count;
          if ((this->m_topf).m_count == uVar2) {
            uVar3 = (this->m_tope).m_count;
            bVar14 = false;
            if (((int)uVar2 < 1 || 2 < (int)uVar3) &&
               ((this->m_topv_map).m_count == mesh_vertex_count)) {
              if (0 < mesh_vertex_count) {
                sVar16 = 0;
                do {
                  if (uVar1 <= (uint)(this->m_topv_map).m_a[sVar16]) goto LAB_0050c879;
                  sVar16 = sVar16 + 1;
                } while (size != sVar16);
              }
              __s = ON_Workspace::GetMemory(&local_68,size);
              memset(__s,0,size);
              if (0 < (int)uVar1) {
                uVar17 = 0;
                do {
                  pOVar23 = (this->m_topv).m_a;
                  if ((pOVar23[uVar17].m_v_count < 1) ||
                     (pOVar23 = pOVar23 + uVar17, pOVar23->m_vi == (int *)0x0)) goto LAB_0050c879;
                  TopVertexPoint(&local_48,this,(int)uVar17);
                  ON_3fPoint::operator=(&local_54,&local_48);
                  if (0 < pOVar23->m_v_count) {
                    lVar21 = 0;
                    do {
                      lVar18 = (long)pOVar23->m_vi[lVar21];
                      bVar14 = false;
                      if ((lVar18 < 0) || (mesh_vertex_count <= pOVar23->m_vi[lVar21]))
                      goto LAB_0050c87b;
                      if ((*(char *)((long)__s + lVar18) != '\0') ||
                         ((iVar15 = compare3fPoint(&local_54,
                                                   (this->m_mesh->m_V).
                                                   super_ON_SimpleArray<ON_3fPoint>.m_a + lVar18),
                          iVar15 != 0 || (uVar17 != (uint)(this->m_topv_map).m_a[lVar18]))))
                      goto LAB_0050c879;
                      *(undefined1 *)((long)__s + lVar18) = 1;
                      lVar21 = lVar21 + 1;
                    } while (lVar21 < pOVar23->m_v_count);
                  }
                  iVar15 = pOVar23->m_tope_count;
                  if (((long)iVar15 < 0) ||
                     (piVar12 = pOVar23->m_topei, (piVar12 == (int *)0x0) != (iVar15 == 0)))
                  goto LAB_0050c879;
                  if (iVar15 != 0) {
                    pOVar22 = (this->m_tope).m_a;
                    lVar21 = 0;
                    do {
                      iVar4 = piVar12[lVar21];
                      lVar18 = (long)iVar4;
                      bVar14 = false;
                      if ((lVar18 < 0) || ((int)uVar3 <= iVar4)) goto LAB_0050c87b;
                      if ((uVar17 != (uint)pOVar22[lVar18].m_topvi[0]) &&
                         (uVar17 != (uint)pOVar22[lVar18].m_topvi[1])) goto LAB_0050c879;
                      if (lVar21 != 0) {
                        lVar18 = 0;
                        do {
                          if (piVar12[lVar18] == iVar4) goto LAB_0050c879;
                          lVar18 = lVar18 + 1;
                        } while (lVar21 != lVar18);
                      }
                      lVar21 = lVar21 + 1;
                    } while (lVar21 != iVar15);
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar17 != uVar1);
              }
              if (0 < mesh_vertex_count) {
                pOVar23 = (this->m_topv).m_a;
                sVar16 = 0;
                bVar14 = false;
                do {
                  if ((*(char *)((long)__s + sVar16) != '\x01') ||
                     (uVar5 = (this->m_topv_map).m_a[sVar16], uVar1 <= uVar5)) goto LAB_0050c879;
                  lVar21 = (long)pOVar23[uVar5].m_v_count;
                  if (lVar21 < 1) goto LAB_0050c879;
                  lVar18 = 0;
                  while (sVar16 != (uint)pOVar23[uVar5].m_vi[lVar18]) {
                    lVar18 = lVar18 + 1;
                    if (lVar21 == lVar18) goto LAB_0050c87b;
                  }
                  sVar16 = sVar16 + 1;
                } while (sVar16 != size);
              }
              if (0 < (int)uVar3) {
                pOVar23 = (this->m_topv).m_a;
                pOVar22 = (this->m_tope).m_a;
                uVar17 = 0;
                do {
                  uVar5 = pOVar22[uVar17].m_topvi[0];
                  if (uVar1 <= uVar5) goto LAB_0050c879;
                  uVar6 = pOVar22[uVar17].m_topvi[1];
                  bVar14 = false;
                  if ((uVar1 <= uVar6) || (uVar5 == uVar6)) goto LAB_0050c87b;
                  if ((long)pOVar23[uVar5].m_tope_count < 1) goto LAB_0050c879;
                  lVar21 = 0;
                  while (uVar17 != (uint)pOVar23[uVar5].m_topei[lVar21]) {
                    lVar21 = lVar21 + 1;
                    bVar14 = false;
                    if (pOVar23[uVar5].m_tope_count == lVar21) goto LAB_0050c87b;
                  }
                  if ((long)pOVar23[(int)uVar6].m_tope_count < 1) goto LAB_0050c879;
                  lVar21 = 0;
                  while (uVar17 != (uint)pOVar23[(int)uVar6].m_topei[lVar21]) {
                    lVar21 = lVar21 + 1;
                    bVar14 = false;
                    if (pOVar23[(int)uVar6].m_tope_count == lVar21) goto LAB_0050c87b;
                  }
                  iVar15 = pOVar22[uVar17].m_topf_count;
                  if (((long)iVar15 < 0) ||
                     ((pOVar22[uVar17].m_topfi == (int *)0x0) != (iVar15 == 0))) goto LAB_0050c879;
                  if (iVar15 != 0) {
                    lVar21 = 0;
                    do {
                      iVar4 = pOVar22[uVar17].m_topfi[lVar21];
                      bVar14 = false;
                      if (((long)iVar4 < 0) || ((int)uVar2 <= iVar4)) goto LAB_0050c87b;
                      lVar18 = 0;
                      while (uVar17 != (uint)(this->m_topf).m_a[iVar4].m_topei[lVar18]) {
                        lVar18 = lVar18 + 1;
                        bVar14 = false;
                        if (lVar18 == 4) goto LAB_0050c87b;
                      }
                      lVar21 = lVar21 + 1;
                    } while (lVar21 != iVar15);
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar17 != uVar3);
              }
              if (0 < (int)uVar2) {
                pOVar13 = (this->m_topf).m_a;
                piVar12 = (this->m_topv_map).m_a;
                pOVar19 = (this->m_mesh->m_F).m_a;
                pOVar22 = (this->m_tope).m_a;
                uVar17 = 0;
                do {
                  iVar15 = pOVar13[uVar17].m_topei[0];
                  bVar14 = false;
                  if ((iVar15 < 0) || ((int)uVar3 <= iVar15)) goto LAB_0050c87b;
                  iVar4 = pOVar13[uVar17].m_topei[1];
                  bVar14 = false;
                  if ((iVar4 < 0) || ((int)uVar3 <= iVar4)) goto LAB_0050c87b;
                  iVar7 = pOVar13[uVar17].m_topei[2];
                  bVar14 = false;
                  if ((iVar7 < 0) || ((int)uVar3 <= iVar7)) goto LAB_0050c87b;
                  iVar8 = pOVar13[uVar17].m_topei[3];
                  bVar14 = false;
                  if ((iVar8 < 0) || ((int)uVar3 <= iVar8)) goto LAB_0050c87b;
                  this_00 = pOVar19 + uVar17;
                  local_88[0] = piVar12[this_00->vi[0]];
                  local_88[1] = piVar12[this_00->vi[1]];
                  iVar9 = this_00->vi[2];
                  local_88[2] = piVar12[iVar9];
                  iVar10 = this_00->vi[3];
                  local_88[3] = piVar12[iVar10];
                  if (((iVar4 != 0 || iVar15 != 0) || iVar7 != 0) || iVar8 != 0) {
                    local_78 = pOVar22;
                    local_70 = pOVar19;
                    bVar14 = ON_MeshFace::IsValid(this_00,mesh_vertex_count);
                    if (!bVar14) goto LAB_0050c879;
                    if (iVar9 == iVar10) {
                      lVar21 = 3;
                      if (iVar7 != iVar8) goto LAB_0050c879;
                    }
                    else {
                      lVar21 = 4;
                      if (iVar7 == iVar8) goto LAB_0050c879;
                    }
                    lVar18 = 0;
                    do {
                      if ((long)local_78[pOVar13[uVar17].m_topei[lVar18]].m_topf_count < 1)
                      goto LAB_0050c879;
                      pOVar22 = local_78 + pOVar13[uVar17].m_topei[lVar18];
                      lVar20 = 0;
                      while (uVar17 != (uint)pOVar22->m_topfi[lVar20]) {
                        lVar20 = lVar20 + 1;
                        bVar14 = false;
                        if (local_78[pOVar13[uVar17].m_topei[lVar18]].m_topf_count == lVar20)
                        goto LAB_0050c87b;
                      }
                      if (pOVar13[uVar17].m_reve[lVar18] == '\0') {
                        if (pOVar22->m_topvi[0] != local_88[(int)lVar18 - 1U & 3])
                        goto LAB_0050c879;
                        iVar15 = pOVar22->m_topvi[1];
                      }
                      else {
                        if (pOVar22->m_topvi[1] != local_88[(int)lVar18 - 1U & 3])
                        goto LAB_0050c879;
                        iVar15 = pOVar22->m_topvi[0];
                      }
                      if (iVar15 != local_88[lVar18]) goto LAB_0050c879;
                      lVar18 = lVar18 + 1;
                      pOVar19 = local_70;
                      pOVar22 = local_78;
                    } while (lVar18 != lVar21);
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar17 != uVar2);
              }
              bVar14 = true;
            }
          }
        }
        goto LAB_0050c87b;
      }
    }
  }
LAB_0050c879:
  bVar14 = false;
LAB_0050c87b:
  ON_Workspace::~ON_Workspace(&local_68);
  return bVar14;
}

Assistant:

bool ON_MeshTopology::IsValid() const
{
  ON_Workspace ws;
  int topvi, topei, topfi, vi, fi, j, jmax, k, tfvi[4];
  ON_3fPoint p;

  WaitUntilReady(0);

  // simple checks
  if ( 1 != m_b32IsValid )
    return false;
  if ( !m_mesh )
    return false;
  if ( this != &(m_mesh->Topology()) )
    return false;
  const int v_count = m_mesh->VertexCount();
  const int f_count = m_mesh->FaceCount();
  const int topv_count = TopVertexCount();
  const int tope_count = TopEdgeCount();
  const int topf_count = TopFaceCount();
  if ( topv_count > v_count || topv_count < 0 )
    return false;
  if ( topv_count == 0 && v_count > 0 )
    return false;
  if ( topf_count != f_count )
    return false;
  if ( f_count > 0 && tope_count < 3 )
    return false;
  if ( m_topv_map.Count() != v_count )
    return false;

  // check vertex information
  for ( vi = 0; vi < v_count; vi++ ) {
    topvi = m_topv_map[vi];
    if ( topvi < 0 || topvi >= topv_count )
      return false;
  }

  char* vCheck = (char*)ws.GetMemory( v_count*sizeof(*vCheck) );
  memset( vCheck, 0, v_count*sizeof(*vCheck) );
  for ( topvi = 0; topvi < topv_count; topvi++ )
  {
    const ON_MeshTopologyVertex& topv = m_topv[topvi];
    if ( topv.m_v_count <= 0 )
      return false;
    if ( !topv.m_vi )
      return false;
    p = TopVertexPoint(topvi);
    for ( j = 0; j < topv.m_v_count; j++ ) {
      vi = topv.m_vi[j];
      if ( vi < 0 )
        return false;
      if ( vi >= v_count )
        return false;
      if ( vCheck[vi] != 0 )
        return false; // mesh.m_V[vi] is referenced multiple times
      if ( compare3fPoint( &p, &m_mesh->m_V[vi] ) )
        return false; // mesh.m_V[vi] not at same location as topv
      if ( m_topv_map[vi] != topvi )
        return false; 
      vCheck[vi] = 1;
    }

    // check that edges in m_topei[] list have topvi has a start/end
    if ( topv.m_tope_count < 0 )
      return false;
    if ( topv.m_tope_count == 0 && topv.m_topei )
      return false; // array should be nullptr
    if ( topv.m_tope_count > 0 && !topv.m_topei )
      return false; // array should not be nullptr
    for ( j = 0; j < topv.m_tope_count; j++ ) {
      topei = topv.m_topei[j];
      if ( topei < 0 )
        return false;
      if ( topei >= tope_count )
        return false;
      const ON_MeshTopologyEdge& tope = m_tope[topei];
      if ( tope.m_topvi[0] != topvi && tope.m_topvi[1] != topvi )
        return false; // edge doesn't reference this top vtx
      for ( k = 0; k < j; k++ ) {
        if ( topv.m_topei[k] == topei )
          return false; // edge listed multiple times
      }
    }
  }

  // make sure every mesh.m_V[] maps to a topological vertex
  for ( vi = 0; vi < v_count; vi++ ) {
    if ( vCheck[vi] != 1 )
      return false; // mesh.m_V[vi] is not referenced
    topvi = m_topv_map[vi];
    if ( topvi < 0 )
      return false;
    if ( topvi >= topv_count )
      return false;
    const ON_MeshTopologyVertex& topv = m_topv[topvi];
    for ( j = 0; j < topv.m_v_count; j++ ) {
      if ( topv.m_vi[j] == vi )
        break;
    }
    if ( j >= topv.m_v_count )
      return false; // bogus m_topv_map[] array
  }

  // check edges
  for ( topei = 0; topei < tope_count; topei++ ) {
    const ON_MeshTopologyEdge& tope = m_tope[topei];
    if ( tope.m_topvi[0] < 0 || tope.m_topvi[0] >= topv_count )
      return false;
    if ( tope.m_topvi[1] < 0 || tope.m_topvi[1] >= topv_count )
      return false;
    if ( tope.m_topvi[0] == tope.m_topvi[1] )
      return false;

    const ON_MeshTopologyVertex& topv0 = m_topv[tope.m_topvi[0]];
    for ( j = 0; j < topv0.m_tope_count; j++ ) {
      if ( topv0.m_topei[j] == topei )
        break;
    }
    if ( j >= topv0.m_tope_count )
      return false; // start vtx not linked to edge

    const ON_MeshTopologyVertex& topv1 = m_topv[tope.m_topvi[1]];
    for ( j = 0; j < topv1.m_tope_count; j++ ) {
      if ( topv1.m_topei[j] == topei )
        break;
    }
    if ( j >= topv1.m_tope_count )
      return false; // end vtx not linked to edge

    if ( tope.m_topf_count < 0 )
      return false;
    if ( tope.m_topf_count == 0 && tope.m_topfi )
      return false; // array should be nullptr
    if ( tope.m_topf_count > 0 && !tope.m_topfi )
      return false; // array should not be nullptr
    for ( j = 0; j < tope.m_topf_count; j++ ) {
      fi = tope.m_topfi[j];
      if ( fi < 0 || fi >= f_count )
        return false;
      const ON_MeshTopologyFace& topf = m_topf[fi];
      for ( k = 0; k < 4; k++ ) {
        if ( topf.m_topei[k] == topei )
          break;
      }
      if ( k >= 4 )
        return false; // edge not in face's list
    }
  }

  // check faces
  for ( fi = 0; fi < f_count; fi++ ) {
    topfi = fi;
    const ON_MeshTopologyFace& topf = m_topf[topfi];
    const ON_MeshFace& f = m_mesh->m_F[fi];
    if ( topf.m_topei[0] < 0 || topf.m_topei[0] >= tope_count )
      return false;
    if ( topf.m_topei[1] < 0 || topf.m_topei[1] >= tope_count )
      return false;
    if ( topf.m_topei[2] < 0 || topf.m_topei[2] >= tope_count )
      return false;
    if ( topf.m_topei[3] < 0 || topf.m_topei[3] >= tope_count )
      return false;
    tfvi[0] = m_topv_map[f.vi[0]];
    tfvi[1] = m_topv_map[f.vi[1]];
    tfvi[2] = m_topv_map[f.vi[2]];
    tfvi[3] = m_topv_map[f.vi[3]];
    if (    topf.m_topei[0] != 0 || topf.m_topei[1] != 0 
         || topf.m_topei[2] != 0 || topf.m_topei[3] != 0 ) {
      if ( !f.IsValid(v_count) )
        return false;
      if ( f.IsTriangle() ) {
        if (topf.m_topei[2] != topf.m_topei[3] )
          return false;
        jmax = 3;
      }
      else {
        if (topf.m_topei[2] == topf.m_topei[3] )
          return false;
        jmax = 4;
      }
      for ( j = 0; j < jmax; j++ ) {
        const ON_MeshTopologyEdge& tope = m_tope[topf.m_topei[j]];
        for ( k = 0; k < tope.m_topf_count; k++ ) {
          if ( tope.m_topfi[k] == topfi )
            break;
        }
        if ( k >= tope.m_topf_count )
          return false;

        // topedge m_tope[topf.m_topei[j]] ENDS at topvtx m_topv[tfvi[j]]
        if ( topf.m_reve[j] ) {
          if ( tope.m_topvi[1] != tfvi[(j+3)%4] )
            return false;
          if ( tope.m_topvi[0] != tfvi[j] )
            return false;
        }
        else {
          if ( tope.m_topvi[0] != tfvi[(j+3)%4] )
            return false;
          if ( tope.m_topvi[1] != tfvi[j] )
            return false;
        }
      }      
    }
    else {
      // all topf.m_topei[] must be zeros
      if (    topf.m_topei[0] != 0 || topf.m_topei[1] != 0 
           || topf.m_topei[2] != 0 || topf.m_topei[3] != 0 )
        return false;
    }
  }
  return true;
}